

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void test_1(void)

{
  double a;
  allocator<char> local_31;
  unique_ptr<Calc,_std::default_delete<Calc>_> calc;
  string local_28;
  
  DefaultCalc();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"1 2 3 42",&local_31);
  a = Calc::eval((Calc *)calc._M_t.super___uniq_ptr_impl<Calc,_std::default_delete<Calc>_>._M_t.
                         super__Tuple_impl<0UL,_Calc_*,_std::default_delete<Calc>_>.
                         super__Head_base<0UL,_Calc_*,_false>._M_head_impl,&local_28);
  AssertEqD(a,42.0,0x30);
  std::__cxx11::string::~string((string *)&local_28);
  std::unique_ptr<Calc,_std::default_delete<Calc>_>::~unique_ptr(&calc);
  return;
}

Assistant:

void test_1() {
  auto calc = DefaultCalc();
  AssertEqD(calc->eval("1 2 3 42"), 42.0, __LINE__);
}